

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  pointer pMVar2;
  long lVar3;
  ostream *poVar4;
  undefined4 in_register_00000034;
  ColourGuard local_58;
  pluralise local_48;
  
  pMVar1 = (this->itMessage)._M_current;
  pMVar2 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar1 != pMVar2) {
    lVar3 = (long)pMVar2 - (long)pMVar1;
    poVar4 = this->stream;
    local_58.m_colourImpl = this->colourImpl;
    local_58.m_engaged = true;
    local_58.m_code = colour;
    (*(local_58.m_colourImpl)->_vptr_ColourImpl[2])
              (local_58.m_colourImpl,CONCAT44(in_register_00000034,colour),lVar3 % 0x48);
    poVar4 = std::operator<<(poVar4," with ");
    local_48.m_label.m_start = "message";
    local_48.m_label.m_size = 7;
    local_48.m_count = (uint64_t)(lVar3 / 0x48);
    Catch::operator<<(poVar4,&local_48);
    std::operator<<(poVar4,':');
    ColourImpl::ColourGuard::~ColourGuard(&local_58);
    while (pMVar1 = (this->itMessage)._M_current, pMVar1 != pMVar2) {
      if ((this->printInfoMessages == false) && (pMVar1->type == Info)) {
        (this->itMessage)._M_current = pMVar1 + 1;
      }
      else {
        printMessage(this);
        if ((this->itMessage)._M_current != pMVar2) {
          poVar4 = this->stream;
          local_48.m_count = (uint64_t)this->colourImpl;
          local_48.m_label.m_start = (char *)CONCAT35(local_48.m_label.m_start._5_3_,0x100000017);
          (*((ColourImpl *)local_48.m_count)->_vptr_ColourImpl[2])(local_48.m_count,0x17);
          std::operator<<(poVar4," and");
          ColourImpl::ColourGuard::~ColourGuard((ColourGuard *)&local_48);
        }
      }
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = compactDimColour) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(itEnd - itMessage);

        stream << colourImpl->guardColour( colour ) << " with "
               << pluralise( N, "message"_sr ) << ':';

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    stream << colourImpl->guardColour(compactDimColour) << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }